

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer3.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::IFF_Layer3::IFF_Layer3(IFF_Layer3 *this)

{
  IFF_Layer3 *this_local;
  
  LayerHeader::LayerHeader(&this->super_LayerHeader);
  (this->super_LayerHeader).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__IFF_Layer3_0033dc58;
  SimulationIdentifier::SimulationIdentifier(&this->m_RptSim);
  this->m_ui16Padding = 0;
  this->m_ui16NumIffRecs = 0;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ::vector(&this->m_vStdVarRecs);
  (this->super_LayerHeader).m_ui8LayerNumber = '\x03';
  (this->super_LayerHeader).m_ui16LayerLength = 0x1c;
  return;
}

Assistant:

IFF_Layer3::IFF_Layer3() :
	m_ui16Padding( 0 ),
	m_ui16NumIffRecs( 0 )	
{
	m_ui8LayerNumber = 3;
	m_ui16LayerLength = IFF_LAYER3_SIZE;
}